

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O0

size_t __thiscall bloaty::Options::ByteSizeLong(Options *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Options *in_RDI;
  int cached_size;
  int n_4;
  int i_4;
  int n_3;
  int i_3;
  CustomDataSource *msg;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<bloaty::CustomDataSource> *__range1;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  int iVar6;
  iterator local_70;
  RepeatedPtrIterator<const_bloaty::CustomDataSource> local_68;
  RepeatedPtrField<bloaty::CustomDataSource> *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  size_t local_38;
  size_t local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  InternalMetadataWithArena *local_8;
  
  local_38 = 0;
  local_3c = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a478f);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  local_38 = sVar4 + local_38;
  local_40 = 0;
  local_44 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1a47b9);
  for (; local_40 < local_44; local_40 = local_40 + 1) {
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a47e0);
    local_38 = sVar4 + local_38;
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a4804);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  local_38 = sVar4 + local_38;
  local_48 = 0;
  local_4c = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1a482e);
  for (; local_48 < local_4c; local_48 = local_48 + 1) {
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a4855);
    local_38 = sVar4 + local_38;
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a4879);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  local_38 = sVar4 + local_38;
  local_50 = 0;
  local_54 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x1a48a3);
  for (; local_50 < local_54; local_50 = local_50 + 1) {
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a48ca);
    local_38 = sVar4 + local_38;
  }
  iVar2 = _internal_custom_data_source_size((Options *)0x1a48ea);
  local_38 = (long)iVar2 + local_38;
  local_60 = &in_RDI->custom_data_source_;
  local_68.it_ = (void **)google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::begin
                                    ((RepeatedPtrField<bloaty::CustomDataSource> *)in_RDI);
  local_70.it_ = (void **)google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::end
                                    ((RepeatedPtrField<bloaty::CustomDataSource> *)
                                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while (bVar1 = google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::
                 operator!=(&local_68,&local_70), bVar1) {
    google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::operator*
              (&local_68);
    sVar4 = google::protobuf::internal::WireFormatLite::MessageSize<bloaty::CustomDataSource>
                      ((CustomDataSource *)0x1a4956);
    local_38 = sVar4 + local_38;
    google::protobuf::internal::RepeatedPtrIterator<const_bloaty::CustomDataSource>::operator++
              (&local_68);
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a4979);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  local_38 = sVar4 + local_38;
  iVar6 = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a49a3);
  for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a49ca);
    local_38 = sVar4 + local_38;
  }
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a49f1);
  sVar4 = google::protobuf::internal::FromIntSize(iVar3);
  local_38 = sVar4 + local_38;
  iVar5 = 0;
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1a4a1e);
  for (; iVar5 < iVar3; iVar5 = iVar5 + 1) {
    google::protobuf::
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          (int)((ulong)in_RDI >> 0x20));
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a4a48);
    local_38 = sVar4 + local_38;
  }
  local_18 = &in_RDI->_has_bits_;
  local_1c = 0;
  local_3c = local_18->has_bits_[0];
  if ((local_3c & 0xff) != 0) {
    if ((local_3c & 1) != 0) {
      _internal_disassemble_function_abi_cxx11_((Options *)0x1a4ab2);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a4aba);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 2) != 0) {
      _internal_source_filter_abi_cxx11_((Options *)0x1a4add);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x1a4ae5);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 4) != 0) {
      _internal_demangle(in_RDI);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(0);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 8) != 0) {
      _internal_sort_by(in_RDI);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(0);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 0x10) != 0) {
      _internal_verbose_level(in_RDI);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(0);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 0x20) != 0) {
      local_38 = local_38 + 2;
    }
    if ((local_3c & 0x40) != 0) {
      _internal_debug_vmaddr(in_RDI);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(0x1a4ba8);
      local_38 = sVar4 + 1 + local_38;
    }
    if ((local_3c & 0x80) != 0) {
      _internal_debug_fileoff(in_RDI);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(0x1a4bd5);
      local_38 = sVar4 + 1 + local_38;
    }
  }
  if ((local_3c & 0x100) != 0) {
    _internal_max_rows_per_level(in_RDI);
    sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(0x1a4c04);
    local_38 = sVar4 + 1 + local_38;
  }
  local_10 = &in_RDI->_internal_metadata_;
  local_8 = local_10;
  if (((uint)(local_10->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_28 = google::protobuf::internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)CONCAT44(iVar6,iVar2),CONCAT44(iVar5,iVar3),
                          (CachedSize *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    iVar2 = google::protobuf::internal::ToCachedSize(local_38);
    SetCachedSize((Options *)CONCAT44(iVar2,in_stack_ffffffffffffff70),(int)((ulong)in_RDI >> 0x20))
    ;
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

size_t Options::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:bloaty.Options)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string filename = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(filename_.size());
  for (int i = 0, n = filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      filename_.Get(i));
  }

  // repeated string base_filename = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(base_filename_.size());
  for (int i = 0, n = base_filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      base_filename_.Get(i));
  }

  // repeated string data_source = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(data_source_.size());
  for (int i = 0, n = data_source_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      data_source_.Get(i));
  }

  // repeated .bloaty.CustomDataSource custom_data_source = 8;
  total_size += 1UL * this->_internal_custom_data_source_size();
  for (const auto& msg : this->custom_data_source_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string debug_filename = 10;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(debug_filename_.size());
  for (int i = 0, n = debug_filename_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      debug_filename_.Get(i));
  }

  // repeated string source_map = 15;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(source_map_.size());
  for (int i = 0, n = source_map_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      source_map_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string disassemble_function = 9;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_disassemble_function());
    }

    // optional string source_filter = 13;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_source_filter());
    }

    // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_demangle());
    }

    // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_sort_by());
    }

    // optional int32 verbose_level = 7;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_verbose_level());
    }

    // optional bool dump_raw_map = 14;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

    // optional uint64 debug_vmaddr = 11;
    if (cached_has_bits & 0x00000040u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_debug_vmaddr());
    }

    // optional uint64 debug_fileoff = 12;
    if (cached_has_bits & 0x00000080u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_debug_fileoff());
    }

  }
  // optional int64 max_rows_per_level = 4 [default = 20];
  if (cached_has_bits & 0x00000100u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
        this->_internal_max_rows_per_level());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}